

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::ArenaTest_CopyValuesWithinOneof_Test::TestBody
          (ArenaTest_CopyValuesWithinOneof_Test *this)

{
  uint32_t uVar1;
  long lVar2;
  ulong uVar3;
  TestOneof *this_00;
  TestAllTypes *pTVar4;
  undefined8 *puVar5;
  Arena *pAVar6;
  undefined1 *puVar7;
  pointer *__ptr;
  char *in_R9;
  string_view value;
  AssertionResult gtest_ar_;
  Arena arena;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_100;
  AssertHelper local_f8;
  internal local_f0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e8;
  string local_e0;
  ThreadSafeArena local_c0;
  
  protobuf::internal::ThreadSafeArena::ThreadSafeArena(&local_c0);
  this_00 = (TestOneof *)Arena::DefaultConstruct<proto2_unittest::TestOneof>((Arena *)&local_c0);
  if ((this_00->field_0)._impl_._oneof_case_[0] != 4) {
    proto2_unittest::TestOneof::clear_foo(this_00);
    (this_00->field_0)._impl_._oneof_case_[0] = 4;
    pAVar6 = (Arena *)(this_00->super_Message).super_MessageLite._internal_metadata_.ptr_;
    if (((ulong)pAVar6 & 1) != 0) {
      pAVar6 = *(Arena **)((ulong)pAVar6 & 0xfffffffffffffffe);
    }
    pTVar4 = (TestAllTypes *)Arena::DefaultConstruct<proto2_unittest::TestOneof_FooGroup>(pAVar6);
    (this_00->field_0)._impl_.foo_.foo_message_ = pTVar4;
  }
  lVar2 = *(long *)&this_00->field_0;
  *(undefined4 *)(lVar2 + 0x20) = 100;
  *(byte *)(lVar2 + 0x10) = *(byte *)(lVar2 + 0x10) | 3;
  pAVar6 = *(Arena **)(lVar2 + 8);
  if (((ulong)pAVar6 & 1) != 0) {
    pAVar6 = *(Arena **)((ulong)pAVar6 & 0xfffffffffffffffe);
  }
  value._M_str = "hello world";
  value._M_len = 0xb;
  protobuf::internal::ArenaStringPtr::Set((ArenaStringPtr *)(lVar2 + 0x18),value,pAVar6);
  uVar1 = (this_00->field_0)._impl_._oneof_case_[0];
  if (uVar1 == 4) {
    puVar7 = (undefined1 *)(this_00->field_0)._impl_.foo_.foo_message_;
  }
  else {
    puVar7 = proto2_unittest::_TestOneof_FooGroup_default_instance_;
  }
  uVar3 = *(ulong *)((long)&((TestAllTypes *)puVar7)->field_0 + 8);
  if (uVar1 != 2) {
    proto2_unittest::TestOneof::clear_foo(this_00);
    (this_00->field_0)._impl_._oneof_case_[0] = 2;
    (this_00->field_0)._impl_.foo_.foo_message_ =
         (TestAllTypes *)&protobuf::internal::fixed_address_empty_string;
  }
  pAVar6 = (Arena *)(this_00->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar6 & 1) != 0) {
    pAVar6 = *(Arena **)((ulong)pAVar6 & 0xfffffffffffffffe);
  }
  protobuf::internal::ArenaStringPtr::Set<>
            ((ArenaStringPtr *)&(this_00->field_0)._impl_,(string *)(uVar3 & 0xfffffffffffffffc),
             pAVar6);
  if ((this_00->field_0)._impl_._oneof_case_[0] == 2) {
    puVar5 = (undefined8 *)((ulong)(this_00->field_0)._impl_.foo_.foo_message_ & 0xfffffffffffffffc)
    ;
  }
  else {
    puVar5 = &protobuf::internal::fixed_address_empty_string;
  }
  local_f0[0] = (internal)(puVar5[1] == 0);
  local_e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_f0[0]) {
    testing::Message::Message((Message *)&local_100);
    if ((this_00->field_0)._impl_._oneof_case_[0] == 2) {
      puVar5 = (undefined8 *)
               ((ulong)(this_00->field_0)._impl_.foo_.foo_message_ & 0xfffffffffffffffc);
    }
    else {
      puVar5 = &protobuf::internal::fixed_address_empty_string;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_100._M_head_impl + 0x10),(char *)*puVar5,puVar5[1]);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_e0,local_f0,(AssertionResult *)"message->foo_string().empty()","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x61f,local_e0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    if (local_100._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_100._M_head_impl + 8))();
    }
  }
  if (local_e8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e8,local_e8);
  }
  protobuf::internal::ThreadSafeArena::~ThreadSafeArena(&local_c0);
  return;
}

Assistant:

TEST(ArenaTest, CopyValuesWithinOneof) {
  if (!internal::DebugHardenClearOneofMessageOnArena()) {
    GTEST_SKIP() << "arena allocated oneof message fields are not hardened.";
  }

  Arena arena;
  auto* message = Arena::Create<unittest::TestOneof>(&arena);
  auto* foo = message->mutable_foogroup();
  foo->set_a(100);
  foo->set_b("hello world");
  message->set_foo_string(message->foogroup().b());

  // As a debug hardening measure, `set_foo_string` would clear `foo` in
  // (!NDEBUG && !ASAN) and the copy wouldn't work.
  EXPECT_TRUE(message->foo_string().empty()) << message->foo_string();
}